

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void readObject(ifstream *stream)

{
  uint32_t uVar1;
  uint32_t uVar2;
  byte *pbVar3;
  uint32_t id;
  uint local_1c;
  
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  uVar1 = readUINT32(stream);
  local_1c = uVar1 & 0xffffff;
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  uVar2 = readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  readUINT32(stream);
  switch(uVar1 >> 0x18) {
  case 0:
    pbVar3 = (byte *)std::
                     map<unsigned_int,_char,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_char>_>_>
                     ::at(&itemSubtype,&local_1c);
    if (*pbVar3 - 4 < 3) goto LAB_001025e3;
    if (*pbVar3 != 3) goto switchD_0010254b_caseD_3;
    goto LAB_001025db;
  case 1:
    readUINT32(stream);
    readUINT32(stream);
    readUINT32(stream);
    readUINT32(stream);
    readUINT32(stream);
    readUINT32(stream);
    break;
  case 2:
    pbVar3 = (byte *)std::
                     map<unsigned_int,_char,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_char>_>_>
                     ::at(&scenerySubtype,&local_1c);
    if (*pbVar3 - 1 < 4) goto LAB_001025db;
    if (*pbVar3 != 0) goto switchD_0010254b_caseD_3;
    goto LAB_001025e3;
  default:
    goto switchD_0010254b_caseD_3;
  case 5:
    if (local_1c == 0xc) goto switchD_0010254b_caseD_3;
  }
  readUINT32(stream);
  readUINT32(stream);
LAB_001025db:
  readUINT32(stream);
LAB_001025e3:
  readUINT32(stream);
switchD_0010254b_caseD_3:
  if (0 < (int)uVar2) {
    do {
      readUINT32(stream);
      readObject(stream);
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void readObject(std::ifstream& stream)
{
    readUINT32(stream); // unknown 0
    readINT32(stream);  // position
    readUINT32(stream); // unknown 1
    readUINT32(stream); // unknown 2
    readUINT32(stream); // unknown 3
    readUINT32(stream); // unknown 4
    readUINT32(stream); // frame number
    readUINT32(stream); // orientation
    readUINT32(stream); // FID
    readUINT32(stream); // FLAGS
    readUINT32(stream); // elevation
    uint32_t PID = readUINT32(stream);

    uint32_t type = (PID & 0xFF000000) >> 24;
    uint32_t id  = PID & 0x00FFFFFF;

    readUINT32(stream); // unknown 5
    readUINT32(stream); // unknown 6
    readUINT32(stream); // unknown 7
    readUINT32(stream); // unknown 8
    readUINT32(stream); // SID
    readUINT32(stream); // SID
    int32_t inventorySize = readINT32(stream);
    readUINT32(stream); // unknown 9
    readUINT32(stream); // unknown 10
    readUINT32(stream); // unknown 11

    switch (type)
    {
        case 0: // items
        {
            uint32_t subtype = itemSubtype.at(id);
            switch (subtype)
            {
                case 0: // armor
                    break;
                case 1: // container
                    break;
                case 2: // drug
                    break;
                case 3: // weapon
                    readUINT32(stream);
                    readUINT32(stream);
                    break;
                case 4: // ammo
                    readUINT32(stream);
                    break;
                case 5: // misc
                    readUINT32(stream);
                    break;
                case 6: // key
                    readUINT32(stream);
                    break;
            }
            break;
        }
        case 1: // critters:
            readUINT32(stream);
            readUINT32(stream);
            readUINT32(stream);
            readUINT32(stream);
            readUINT32(stream);
            readUINT32(stream);
            readUINT32(stream);
            readUINT32(stream);
            readUINT32(stream);
            readUINT32(stream);
            break;
        case 2: // scenery
        {
            uint32_t subtype = scenerySubtype.at(id);
            switch (subtype)
            {
                case 0: // door
                    readUINT32(stream);
                    break;
                case 1: // stairs
                    readUINT32(stream);
                    readUINT32(stream);
                    break;
                case 2: // elevator
                    readUINT32(stream);
                    readUINT32(stream);
                    break;
                case 3: // ladder bottom
                    readUINT32(stream);
                    readUINT32(stream);
                    break;
                case 4: // ladder top
                    readUINT32(stream);
                    readUINT32(stream);
                    break;
                case 5: // generic
                    break;
            }
            break;
        }
        case 3:
            break;
        case 4:
            break;
        case 5:
        {
            switch(id)
            {
                case 12:
                    break;
                // Exit Grids
                case 16:
                case 17:
                case 18:
                case 19:
                case 20:
                case 21:
                case 22:
                case 23:
                    readUINT32(stream);
                    readUINT32(stream);
                    readUINT32(stream);
                    readUINT32(stream);
                    break;
                default:
                    readUINT32(stream);
                    readUINT32(stream);
                    readUINT32(stream);
                    readUINT32(stream);
                    break;
            }
            break;
        }
    }

    if (inventorySize > 0)
    {
        for (unsigned i = 0; i != inventorySize; ++i)
        {
            readUINT32(stream); // ammount
            readObject(stream);
        }
    }
}